

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void run_container_union(run_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  ushort uVar1;
  ushort uVar2;
  rle16_t rVar3;
  rle16_t rVar4;
  rle16_t *prVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  bool bVar16;
  
  bVar15 = false;
  if ((src_1->n_runs == 1) && (src_1->runs->value == 0)) {
    bVar15 = src_1->runs->length == 0xffff;
  }
  bVar16 = false;
  if ((src_2->n_runs == 1) && (bVar16 = false, src_2->runs->value == 0)) {
    bVar16 = src_2->runs->length == 0xffff;
  }
  if (((bool)(bVar16 | bVar15)) && ((bool)(bVar16 | bVar15))) {
    if (bVar15) {
      src_2 = src_1;
    }
    run_container_copy(src_2,dst);
    return;
  }
  iVar9 = src_2->n_runs + src_1->n_runs;
  if (dst->capacity < iVar9) {
    run_container_grow(dst,iVar9,false);
  }
  dst->n_runs = 0;
  uVar1 = src_1->runs->value;
  uVar2 = src_2->runs->value;
  uVar7 = (ulong)(uVar1 <= uVar2);
  uVar6 = (uint)(uVar1 <= uVar2);
  uVar11 = (ulong)(uVar2 < uVar1);
  uVar10 = (uint)(uVar2 < uVar1);
  prVar5 = src_1->runs;
  if (uVar2 < uVar1) {
    prVar5 = src_2->runs;
  }
  rVar4 = *prVar5;
  *dst->runs = rVar4;
  dst->n_runs = dst->n_runs + 1;
  uVar8 = (uint)rVar4 >> 0x10;
  if ((int)uVar10 < src_2->n_runs) {
    do {
      uVar10 = (uint)uVar11;
      uVar6 = (uint)uVar7;
      if (src_1->n_runs <= (int)uVar6) break;
      uVar1 = src_1->runs[uVar7].value;
      uVar2 = src_2->runs[uVar11].value;
      prVar5 = src_1->runs + uVar7;
      if (uVar2 < uVar1) {
        prVar5 = src_2->runs + uVar11;
      }
      rVar3 = *prVar5;
      uVar13 = (uint)rVar4 & 0xffff;
      if (uVar13 + (uVar8 & 0xffff) + 1 < ((uint)rVar3 & 0xffff)) {
        prVar5 = dst->runs;
        iVar9 = dst->n_runs;
        prVar5[iVar9].value = rVar3.value;
        prVar5[iVar9].length = rVar3.length;
        dst->n_runs = iVar9 + 1;
        rVar4 = rVar3;
        uVar8 = (uint)rVar3 >> 0x10;
      }
      else {
        uVar14 = ((uint)rVar3 & 0xffff) + ((uint)rVar3 >> 0x10);
        if ((uVar8 & 0xffff) + uVar13 <= uVar14) {
          uVar8 = uVar14 - uVar13;
          dst->runs[(long)dst->n_runs + -1] = (rle16_t)(uVar8 * 0x10000 | uVar13);
        }
      }
      uVar10 = uVar10 + (uVar2 < uVar1);
      uVar11 = (ulong)uVar10;
      uVar6 = uVar6 + (uVar1 <= uVar2);
      uVar7 = (ulong)uVar6;
    } while ((int)uVar10 < src_2->n_runs);
  }
  if ((int)uVar10 < src_2->n_runs) {
    lVar12 = (long)(int)uVar10;
    do {
      rVar3 = src_2->runs[lVar12];
      uVar10 = (uint)rVar4 & 0xffff;
      if (uVar10 + (uVar8 & 0xffff) + 1 < ((uint)rVar3 & 0xffff)) {
        prVar5 = dst->runs;
        iVar9 = dst->n_runs;
        prVar5[iVar9].value = rVar3.value;
        prVar5[iVar9].length = rVar3.length;
        dst->n_runs = iVar9 + 1;
        rVar4 = rVar3;
        uVar8 = (uint)rVar3 >> 0x10;
      }
      else {
        uVar13 = ((uint)rVar3 & 0xffff) + ((uint)rVar3 >> 0x10);
        if ((uVar8 & 0xffff) + uVar10 <= uVar13) {
          uVar8 = uVar13 - uVar10;
          dst->runs[(long)dst->n_runs + -1] = (rle16_t)(uVar8 * 0x10000 | uVar10);
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < src_2->n_runs);
  }
  if ((int)uVar6 < src_1->n_runs) {
    lVar12 = (long)(int)uVar6;
    do {
      rVar3 = src_1->runs[lVar12];
      uVar6 = (uint)rVar4 & 0xffff;
      if (uVar6 + (uVar8 & 0xffff) + 1 < ((uint)rVar3 & 0xffff)) {
        prVar5 = dst->runs;
        iVar9 = dst->n_runs;
        prVar5[iVar9].value = rVar3.value;
        prVar5[iVar9].length = rVar3.length;
        dst->n_runs = iVar9 + 1;
        rVar4 = rVar3;
        uVar8 = (uint)rVar3 >> 0x10;
      }
      else {
        uVar10 = ((uint)rVar3 & 0xffff) + ((uint)rVar3 >> 0x10);
        if ((uVar8 & 0xffff) + uVar6 <= uVar10) {
          uVar8 = uVar10 - uVar6;
          dst->runs[(long)dst->n_runs + -1] = (rle16_t)(uVar8 * 0x10000 | uVar6);
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < src_1->n_runs);
  }
  return;
}

Assistant:

void run_container_union(const run_container_t *src_1,
                         const run_container_t *src_2, run_container_t *dst) {
    // TODO: this could be a lot more efficient

    // we start out with inexpensive checks
    const bool if1 = run_container_is_full(src_1);
    const bool if2 = run_container_is_full(src_2);
    if (if1 || if2) {
        if (if1) {
            run_container_copy(src_1, dst);
            return;
        }
        if (if2) {
            run_container_copy(src_2, dst);
            return;
        }
    }
    const int32_t neededcapacity = src_1->n_runs + src_2->n_runs;
    if (dst->capacity < neededcapacity)
        run_container_grow(dst, neededcapacity, false);
    dst->n_runs = 0;
    int32_t rlepos = 0;
    int32_t xrlepos = 0;

    rle16_t previousrle;
    if (src_1->runs[rlepos].value <= src_2->runs[xrlepos].value) {
        previousrle = run_container_append_first(dst, src_1->runs[rlepos]);
        rlepos++;
    } else {
        previousrle = run_container_append_first(dst, src_2->runs[xrlepos]);
        xrlepos++;
    }

    while ((xrlepos < src_2->n_runs) && (rlepos < src_1->n_runs)) {
        rle16_t newrl;
        if (src_1->runs[rlepos].value <= src_2->runs[xrlepos].value) {
            newrl = src_1->runs[rlepos];
            rlepos++;
        } else {
            newrl = src_2->runs[xrlepos];
            xrlepos++;
        }
        run_container_append(dst, newrl, &previousrle);
    }
    while (xrlepos < src_2->n_runs) {
        run_container_append(dst, src_2->runs[xrlepos], &previousrle);
        xrlepos++;
    }
    while (rlepos < src_1->n_runs) {
        run_container_append(dst, src_1->runs[rlepos], &previousrle);
        rlepos++;
    }
}